

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<unsigned_long_long,_QWidget_*>_>::
findBucketWithHash<unsigned_long_long>
          (Data<QHashPrivate::Node<unsigned_long_long,_QWidget_*>_> *this,unsigned_long_long *key,
          size_t hash)

{
  ulong uVar1;
  long in_FS_OFFSET;
  Bucket BVar2;
  Bucket local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->numBuckets - 1 & hash;
  local_30.span = this->spans + (uVar1 >> 7);
  local_30.index = (size_t)((uint)uVar1 & 0x7f);
  while (((local_30.span)->offsets[local_30.index] != 0xff &&
         (*(unsigned_long_long *)
           (local_30.span)->entries[(local_30.span)->offsets[local_30.index]].storage.data != *key))
        ) {
    Bucket::advanceWrapped(&local_30,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    BVar2.index = local_30.index;
    BVar2.span = local_30.span;
    return BVar2;
  }
  __stack_chk_fail();
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }